

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O1

shared_ptr<spdlog::logger> __thiscall
spdlog::
create<spdlog::sinks::rotating_file_sink<std::mutex>,std::__cxx11::string,unsigned_long,unsigned_long>
          (spdlog *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  registry_t<std::mutex> *logger_name_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<spdlog::logger> sVar3;
  shared_ptr<spdlog::sinks::sink> local_58;
  shared_ptr<spdlog::sinks::sink> *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  shared_ptr<spdlog::sinks::sink> **local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40 = args_2;
  local_38 = args_1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::sinks::rotating_file_sink<std::mutex>,std::allocator<spdlog::sinks::rotating_file_sink<std::mutex>>,std::__cxx11::string&,unsigned_long&,unsigned_long&>
            (&local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(rotating_file_sink<std::mutex> **)&local_58,
             (allocator<spdlog::sinks::rotating_file_sink<std::mutex>_> *)&local_48,args,&local_38,
             &local_40);
  this_00._M_pi =
       local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  peVar1 = local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  logger_name_00 = details::registry_t<std::mutex>::instance();
  if (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_30 = &local_48;
  local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_48 = &local_58;
  sVar3 = details::registry_t<std::mutex>::create<std::shared_ptr<spdlog::sinks::sink>const*>
                    ((registry_t<std::mutex> *)this,(string *)logger_name_00,
                     (shared_ptr<spdlog::sinks::sink> **)logger_name,&local_48);
  _Var2 = sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}